

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyBoundaryIndicesAreSorted.hpp
# Opt level: O2

void njoy::ENDFtk::record::InterpolationBase::verifyBoundaryIndicesAreSorted
               (vector<long,_std::allocator<long>_> *boundaryIndices)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var1;
  undefined8 *puVar2;
  char *unaff_RBX;
  long args_1;
  
  _Var1 = std::
          __is_sorted_until<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  args_1 = (long)_Var1._M_current -
           (long)(boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  tools::Log::info<char_const*,long,long>
            ("Boundary index [{}]: {}",args_1 + -1,_Var1._M_current[-1]);
  tools::Log::info<char_const*,long,long>("Boundary index [{}]: {}",args_1,*_Var1._M_current);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyBoundaryIndicesAreSorted( const std::vector< long >& boundaryIndices ){
  auto boundaryIndexIterator = 
    std::is_sorted_until( boundaryIndices.begin(), boundaryIndices.end() );

  const bool boundariesAreSorted =
    ( boundaryIndexIterator == boundaryIndices.end() );
 
  if ( not boundariesAreSorted ){
    Log::error( "Interpolation boundary indices are not sorted" );
    const auto position = boundaryIndexIterator - boundaryIndices.begin();
    Log::info( "Boundary index [{}]: {}",
               (position - 1), boundaryIndexIterator[-1] );
    Log::info( "Boundary index [{}]: {}", position, boundaryIndexIterator[0] );
    throw std::exception();
  }
}